

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O3

void __thiscall sing::HttpResponse::makeErrorResponse(HttpResponse *this,string *msg)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  HttpStatusCode HVar4;
  bool bVar5;
  HttpStatusCode __val;
  uint uVar6;
  char cVar7;
  long *plVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  uint uVar11;
  long *plVar12;
  size_type *psVar13;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  uint __len;
  string __str_1;
  string __str;
  key_type local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string *local_60;
  long *local_58 [2];
  long local_48 [2];
  HttpStatusCode local_34;
  
  psVar1 = &this->body;
  local_60 = msg;
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  HVar4 = this->code;
  __val = -HVar4;
  if (0 < (int)HVar4) {
    __val = HVar4;
  }
  __len = 1;
  if (9 < __val) {
    uVar15 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_0010bbfc;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_0010bbfc;
      }
      if (uVar11 < 10000) goto LAB_0010bbfc;
      uVar15 = uVar15 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar11);
    __len = __len + 1;
  }
LAB_0010bbfc:
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct((ulong)local_58,(char)__len - (char)((int)HVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_58[0] + (ulong)(HVar4 >> 0x1f)),__len,__val);
  plVar8 = (long *)std::__cxx11::string::append((char *)local_58);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_70 = *plVar12;
    lStack_68 = plVar8[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar12;
    local_80 = (long *)*plVar8;
  }
  local_78 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_34 = this->code;
  pmVar9 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&statusCode2Message_abi_cxx11_,(key_type *)&local_34);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_80,(ulong)(pmVar9->_M_dataplus)._M_p);
  paVar2 = &local_a0.field_2;
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_a0.field_2._M_allocated_capacity = *psVar13;
    local_a0.field_2._8_8_ = plVar8[3];
    local_a0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar13;
    local_a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
  paVar3 = &local_c0.field_2;
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_c0.field_2._M_allocated_capacity = *psVar13;
    local_c0.field_2._8_8_ = plVar8[3];
    local_c0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar13;
    local_c0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_c0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  std::operator+(&local_a0,"<p>",local_60);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_c0.field_2._M_allocated_capacity = *psVar13;
    local_c0.field_2._8_8_ = plVar8[3];
    local_c0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar13;
    local_c0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_c0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)psVar1);
  local_c0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Content-Type","");
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"text/html","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->headers,&local_c0);
  std::__cxx11::string::_M_assign((string *)pmVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Content-Length","");
  uVar15 = (this->body)._M_string_length;
  cVar16 = '\x01';
  if (9 < uVar15) {
    uVar14 = uVar15;
    cVar7 = '\x04';
    do {
      cVar16 = cVar7;
      if (uVar14 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_0010bf80;
      }
      if (uVar14 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_0010bf80;
      }
      if (uVar14 < 10000) goto LAB_0010bf80;
      bVar5 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar7 = cVar16 + '\x04';
    } while (bVar5);
    cVar16 = cVar16 + '\x01';
  }
LAB_0010bf80:
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_a0,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,uVar15);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->headers,&local_c0);
  std::__cxx11::string::_M_assign((string *)pmVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HttpResponse::makeErrorResponse(const std::string& msg){//FIX ME: send error page html file
    body += "<html><title>Server Error</title>";
    body += "<body bgcolor=\"ffffff\">";
    body += std::to_string(this->code) + " : " + statusCode2Message.at(code) + "\n";
    body += "<p>" + msg + "</p>";
    body += "<hr><em>sing web server</em></body></html>";
    addHeader("Content-Type", "text/html");
    addHeader("Content-Length", std::to_string(body.size()));
}